

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O1

void __thiscall Lib::Array<bool>::expandToFit(Array<bool> *this,size_t n)

{
  size_t sVar1;
  bool *pbVar2;
  bool bVar3;
  bool *__s;
  uint uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  size_t __n;
  bool *res;
  
  uVar7 = this->_capacity * 2;
  __n = n + 1;
  if (n < uVar7) {
    __n = uVar7;
  }
  uVar7 = __n + 0xf & 0xfffffffffffffff0;
  if (uVar7 == 0) {
    __s = (bool *)FixedSizeAllocator<8UL>::alloc
                            ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar7 < 0x11) {
    __s = (bool *)FixedSizeAllocator<16UL>::alloc
                            ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar7 < 0x19) {
    __s = (bool *)FixedSizeAllocator<24UL>::alloc
                            ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar7 < 0x21) {
    __s = (bool *)FixedSizeAllocator<32UL>::alloc
                            ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar7 < 0x31) {
    __s = (bool *)FixedSizeAllocator<48UL>::alloc
                            ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar7 < 0x41) {
    __s = (bool *)FixedSizeAllocator<64UL>::alloc
                            ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    __s = (bool *)::operator_new(uVar7,0x10);
  }
  if (__n != 0) {
    memset(__s,0,__n);
  }
  sVar1 = this->_capacity;
  if ((sVar1 != 0) && (uVar4 = (int)sVar1 - 1, -1 < (int)uVar4)) {
    pbVar2 = this->_array;
    lVar5 = (ulong)uVar4 + 1;
    do {
      __s[lVar5 + -1] = pbVar2[lVar5 + -1];
      lVar6 = lVar5 + -1;
      bVar3 = 0 < lVar5;
      lVar5 = lVar6;
    } while (lVar6 != 0 && bVar3);
  }
  pbVar2 = this->_array;
  if (pbVar2 != (bool *)0x0) {
    uVar7 = sVar1 + 0xf & 0xfffffffffffffff0;
    if (uVar7 == 0) {
      *(undefined8 *)pbVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pbVar2;
    }
    else if (uVar7 < 0x11) {
      *(undefined8 *)pbVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pbVar2;
    }
    else if (uVar7 < 0x19) {
      *(undefined8 *)pbVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pbVar2;
    }
    else if (uVar7 < 0x21) {
      *(undefined8 *)pbVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pbVar2;
    }
    else if (uVar7 < 0x31) {
      *(undefined8 *)pbVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pbVar2;
    }
    else if (uVar7 < 0x41) {
      *(undefined8 *)pbVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pbVar2;
    }
    else {
      operator_delete(pbVar2,0x10);
    }
  }
  this->_array = __s;
  (**this->_vptr_Array)(this,this->_capacity,__n);
  this->_capacity = __n;
  return;
}

Assistant:

void expandToFit (size_t n)
  {
    ASS(n >= _capacity);

    // determine new capacity (at least double the old one)
    size_t newCapacity = 2 * _capacity;
    if (newCapacity <= n) {
      newCapacity = n+1;
    }

    // allocate new array and copy old array's content to the new place
    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"Array<>");
    C* newArray = array_new<C>(mem, newCapacity);
    if(_capacity) {
      for (int i = _capacity-1;i >= 0;i--) {
	newArray[i] = _array[i];
      }
    }

    if(_array) {
      // deallocate the old array
      array_delete(_array,_capacity);
      DEALLOC_KNOWN(_array,_capacity*sizeof(C),"Array<>");
    }

    _array = newArray;
    fillInterval(_capacity,newCapacity);
    _capacity = newCapacity;
  }